

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckTH(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  Bool BVar2;
  uint uVar3;
  ctmbstr str;
  char cVar4;
  tmbstr str_00;
  ctmbstr cp_1;
  ctmbstr ptVar5;
  ctmbstr cp;
  char *pcVar6;
  AttVal *pAVar7;
  
  if ((doc->access).PRIORITYCHK == 3) {
    pAVar7 = node->attributes;
    if (pAVar7 == (AttVal *)0x0) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
      do {
        if ((pAVar7->dict != (Attribute *)0x0) && (pAVar7->dict->id == TidyAttr_ABBR)) {
          pcVar6 = pAVar7->value;
          if (pcVar6 == (char *)0x0) {
LAB_00152cb7:
            prvTidyReportAccessError(doc,node,0x2cf);
            bVar1 = true;
          }
          else {
            do {
              if (*pcVar6 == '\0') goto LAB_00152ca5;
              BVar2 = prvTidyIsWhite((int)*pcVar6);
              pcVar6 = pcVar6 + 1;
            } while (BVar2 != no);
            bVar1 = true;
LAB_00152ca5:
            if ((pAVar7->value == (ctmbstr)0x0) ||
               (uVar3 = prvTidytmbstrlen(pAVar7->value), uVar3 == 0)) goto LAB_00152cb7;
          }
          pcVar6 = pAVar7->value;
          if (pcVar6 == (char *)0x0) {
            str_00 = (ctmbstr)0x0;
          }
          else {
            cVar4 = *pcVar6;
            if (cVar4 != '\0') {
              do {
                pcVar6 = pcVar6 + 1;
                BVar2 = prvTidyIsWhite((int)cVar4);
                if (BVar2 == no) goto LAB_00152d24;
                cVar4 = *pcVar6;
              } while (cVar4 != '\0');
              if (BVar2 != yes) goto LAB_00152d24;
            }
            str_00 = pAVar7->value;
          }
          uVar3 = prvTidytmbstrlen(str_00);
          if (uVar3 != 0) {
            prvTidyReportAccessError(doc,node,0x2d0);
            bVar1 = true;
          }
        }
LAB_00152d24:
        pAVar7 = pAVar7->next;
      } while (pAVar7 != (AttVal *)0x0);
      bVar1 = !bVar1;
    }
    str = textFromOneNode(doc,node->content);
    ptVar5 = str;
    do {
      if (*ptVar5 == '\0') {
        return;
      }
      BVar2 = prvTidyIsWhite((int)*ptVar5);
      ptVar5 = ptVar5 + 1;
    } while (BVar2 != no);
    uVar3 = prvTidytmbstrlen(str);
    if ((bool)(0xf < uVar3 & bVar1)) {
      prvTidyReportAccessError(doc,node,0x2ce);
      return;
    }
  }
  return;
}

Assistant:

static void CheckTH( TidyDocImpl* doc, Node* node )
{
    Bool HasAbbr = no;
    ctmbstr word = NULL;
    AttVal* av;

    if (Level3_Enabled( doc ))
    {
        /* Checks TH element for 'ABBR' attribute */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            if ( attrIsABBR(av) )
            {
                /* Value must not be NULL and must be less than 15 characters */
                if ((av->value != NULL)&&
                    (IsWhitespace (av->value) == no))
                {
                    HasAbbr = yes;
                }

                if ((av->value == NULL)||
                    (TY_(tmbstrlen)(av->value) == 0))
                {
                    HasAbbr = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_MAY_REQUIRE_HEADER_ABBR_NULL);
                }
                
                if ((IsWhitespace (av->value) == yes)&&
                    (TY_(tmbstrlen)(av->value) > 0))
                {
                    HasAbbr = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_MAY_REQUIRE_HEADER_ABBR_SPACES);
                }
            }
        }

        /* If the header is greater than 15 characters, an abbreviation is needed */
        word = textFromOneNode( doc, node->content);

        if ((word != NULL)&&
            (IsWhitespace (word) == no))
        {
            /* Must have 'ABBR' attribute if header is > 15 characters */
            if ((TY_(tmbstrlen)(word) > 15)&&
                (HasAbbr == no))
            {
                TY_(ReportAccessError)( doc, node, TABLE_MAY_REQUIRE_HEADER_ABBR);
            }
        }
    }
}